

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O3

bool google::sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_short>
               (_IO_FILE *fp,unsigned_short value,size_t length)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  undefined1 local_3d;
  uint local_3c;
  size_t local_38;
  
  if (length == 0) {
    bVar6 = true;
  }
  else {
    local_3c = (uint)value;
    bVar6 = false;
    local_3d = (char)(value >> ((char)(length - 1) * '\b' & 0x1fU));
    if (1 < length - 1) {
      local_3d = 0;
    }
    sVar2 = fwrite(&local_3d,1,1,(FILE *)fp);
    if (sVar2 == 1) {
      uVar3 = length - 2;
      iVar5 = (int)length * 8 + -0x10;
      uVar1 = 1;
      local_38 = length;
      do {
        uVar4 = uVar1;
        if (uVar3 == 0xffffffffffffffff) break;
        local_3d = (char)(local_3c >> ((byte)iVar5 & 0x1f));
        if (1 < uVar3) {
          local_3d = 0;
        }
        sVar2 = fwrite(&local_3d,1,1,(FILE *)fp);
        uVar3 = uVar3 - 1;
        iVar5 = iVar5 + -8;
        uVar1 = uVar4 + 1;
      } while (sVar2 == 1);
      bVar6 = local_38 <= uVar4;
    }
  }
  return bVar6;
}

Assistant:

bool write_bigendian_number(OUTPUT* fp, IntType value, size_t length) {
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    byte = (sizeof(value) <= length - 1 - i)
               ? 0
               : static_cast<unsigned char>((value >> ((length - 1 - i) * 8)) &
                                            255);
    if (!write_data(fp, &byte, sizeof(byte))) return false;
  }
  return true;
}